

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_type(_internal_exr_context *ctxt,_internal_exr_part *curpart,
                   _internal_exr_seq_scratch *scratch,char *tname,int32_t attrsz)

{
  long lVar1;
  exr_result_t eVar2;
  int iVar3;
  exr_attribute_t *in_RCX;
  _internal_exr_seq_scratch *in_RDX;
  _internal_exr_context *in_RSI;
  long in_RDI;
  int in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  int32_t n;
  uint8_t *outstr;
  exr_result_t rv;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = check_bad_attrsz(in_RSI,in_RDX,(int32_t)((ulong)in_RCX >> 0x20),(int32_t)in_RCX,
                           (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8,
                           (int32_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  if (eVar2 == 0) {
    lVar1._0_4_ = in_RSI->max_tile_w;
    lVar1._4_4_ = in_RSI->max_tile_h;
    if (lVar1 == 0) {
      iVar3 = strcmp((char *)in_RCX,"string");
      if (iVar3 == 0) {
        eVar2 = exr_attr_list_add_static_name
                          ((exr_context_t)CONCAT44(attrsz,rv),(exr_attribute_list_t *)outstr,
                           in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           (uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(exr_attribute_t **)curpart);
        if (eVar2 == 0) {
          eVar2 = (*in_RDX->sequential_read)(in_RDX,in_stack_ffffffffffffffc8,(long)in_R8D);
          if (eVar2 == 0) {
            in_stack_ffffffffffffffc8[in_R8D] = '\0';
            eVar2 = exr_attr_string_init_static_with_length
                              ((exr_context_t)in_RSI,(exr_attr_string_t *)in_RDX,(char *)in_RCX,
                               in_R8D);
            if (eVar2 == 0) {
              iVar3 = strcmp(in_stack_ffffffffffffffc8,"scanlineimage");
              if (iVar3 == 0) {
                in_RSI->has_nonimage_data = '\0';
                in_RSI->is_multipart = '\0';
                in_RSI->strict_header = '\0';
                in_RSI->silent_header = '\0';
              }
              else {
                iVar3 = strcmp(in_stack_ffffffffffffffc8,"tiledimage");
                if (iVar3 == 0) {
                  in_RSI->has_nonimage_data = '\x01';
                  in_RSI->is_multipart = '\0';
                  in_RSI->strict_header = '\0';
                  in_RSI->silent_header = '\0';
                }
                else {
                  iVar3 = strcmp(in_stack_ffffffffffffffc8,"deepscanline");
                  if (iVar3 == 0) {
                    in_RSI->has_nonimage_data = '\x02';
                    in_RSI->is_multipart = '\0';
                    in_RSI->strict_header = '\0';
                    in_RSI->silent_header = '\0';
                  }
                  else {
                    iVar3 = strcmp(in_stack_ffffffffffffffc8,"deeptile");
                    if (iVar3 == 0) {
                      in_RSI->has_nonimage_data = '\x03';
                      in_RSI->is_multipart = '\0';
                      in_RSI->strict_header = '\0';
                      in_RSI->silent_header = '\0';
                    }
                    else {
                      eVar2 = (**(code **)(in_RDI + 0x48))
                                        (in_RDI,0xe,"attribute \'type\': Invalid type string \'%s\'"
                                         ,in_stack_ffffffffffffffc8);
                      exr_attr_list_remove
                                ((exr_context_t)in_RSI,(exr_attribute_list_t *)in_RDX,in_RCX);
                      in_RSI->max_tile_w = 0;
                      in_RSI->max_tile_h = 0;
                    }
                  }
                }
              }
            }
            else {
              exr_attr_list_remove((exr_context_t)in_RSI,(exr_attribute_list_t *)in_RDX,in_RCX);
              in_RSI->max_tile_w = 0;
              in_RSI->max_tile_h = 0;
              eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,eVar2,"Unable to read \'name\' data");
            }
          }
          else {
            exr_attr_list_remove((exr_context_t)in_RSI,(exr_attribute_list_t *)in_RDX,in_RCX);
            in_RSI->max_tile_w = 0;
            in_RSI->max_tile_h = 0;
            eVar2 = (**(code **)(in_RDI + 0x40))(in_RDI,eVar2,"Unable to read \'name\' data");
          }
        }
        else {
          (*in_RDX->sequential_skip)(in_RDX,(long)in_R8D);
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,eVar2,"Unable to initialize attribute \'%s\', type \'string\'",
                             "type");
        }
      }
      else {
        (*in_RDX->sequential_skip)(in_RDX,(long)in_R8D);
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0x10,"Required attribute \'type\': Invalid type \'%s\'",in_RCX);
      }
    }
    else {
      (*in_RDX->sequential_skip)(in_RDX,(long)in_R8D);
      eVar2 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Duplicate copy of required attribute \'type\' encountered");
    }
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_type (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_part*        curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    uint8_t*     outstr;
    int32_t      n;

    rv = check_bad_attrsz (
        ctxt, scratch, attrsz, 1, EXR_REQ_TYPE_STR, tname, &n);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (curpart->type)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Duplicate copy of required attribute 'type' encountered");
    }

    if (0 != strcmp (tname, "string"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute 'type': Invalid type '%s'",
            tname);
    }

    rv = exr_attr_list_add_static_name (
        (exr_context_t) ctxt,
        &(curpart->attributes),
        EXR_REQ_TYPE_STR,
        EXR_ATTR_STRING,
        attrsz + 1,
        &outstr,
        &(curpart->type));
    if (rv != EXR_ERR_SUCCESS)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'string'",
            EXR_REQ_TYPE_STR);
    }

    rv = scratch->sequential_read (scratch, outstr, (uint64_t) attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (
            (exr_context_t) ctxt, &(curpart->attributes), curpart->type);
        curpart->type = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }
    outstr[attrsz] = '\0';

    rv = exr_attr_string_init_static_with_length (
        (exr_context_t) ctxt,
        curpart->type->string,
        (const char*) outstr,
        attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_list_remove (
            (exr_context_t) ctxt, &(curpart->attributes), curpart->type);
        curpart->type = NULL;
        return ctxt->report_error (ctxt, rv, "Unable to read 'name' data");
    }

    if (strcmp ((const char*) outstr, "scanlineimage") == 0)
        curpart->storage_mode = EXR_STORAGE_SCANLINE;
    else if (strcmp ((const char*) outstr, "tiledimage") == 0)
        curpart->storage_mode = EXR_STORAGE_TILED;
    else if (strcmp ((const char*) outstr, "deepscanline") == 0)
        curpart->storage_mode = EXR_STORAGE_DEEP_SCANLINE;
    else if (strcmp ((const char*) outstr, "deeptile") == 0)
        curpart->storage_mode = EXR_STORAGE_DEEP_TILED;
    else
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "attribute 'type': Invalid type string '%s'",
            outstr);
        exr_attr_list_remove (
            (exr_context_t) ctxt, &(curpart->attributes), curpart->type);
        curpart->type = NULL;
    }

    return rv;
}